

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint _elempack;
  int iVar9;
  Option opt_flatten;
  Mat local_c8;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_c8.dims = bottom_blob->dims;
  if ((local_c8.dims == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]),
                bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    iVar9 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar1 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar8 = cpu_support_x86_f16c();
      iVar9 = 0;
      if (iVar8 != 0) {
        innerproduct_gemm_fp16s_sse_f16c
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar1,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        iVar9 = 0;
      }
    }
  }
  else {
    piVar3 = bottom_blob->refcount;
    local_c8.data = bottom_blob->data;
    local_c8.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_c8.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    local_c8.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_c8.elempack = bottom_blob->elempack;
    local_c8.allocator = bottom_blob->allocator;
    uVar4 = bottom_blob->w;
    uVar5 = bottom_blob->h;
    uVar6 = bottom_blob->d;
    uVar7 = bottom_blob->c;
    local_c8.cstep = bottom_blob->cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_c8.w = uVar4;
    local_c8.h = uVar5;
    local_c8.d = uVar6;
    local_c8.c = uVar7;
    if (bottom_blob->dims != 1) {
      local_78._0_1_ = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78._4_4_ = opt->num_threads;
      pAStack_68 = opt->workspace_allocator;
      uStack_60._0_4_ = opt->openmp_blocktime;
      uStack_60._4_1_ = opt->use_winograd_convolution;
      uStack_60._5_1_ = opt->use_sgemm_convolution;
      uStack_60._6_1_ = opt->use_int8_inference;
      uStack_60._7_1_ = opt->use_vulkan_compute;
      local_58._0_1_ = opt->use_bf16_storage;
      local_58._1_1_ = opt->use_fp16_packed;
      local_58._2_1_ = opt->use_fp16_storage;
      local_58._3_1_ = opt->use_fp16_arithmetic;
      local_58._4_1_ = opt->use_int8_packed;
      local_58._5_1_ = opt->use_int8_storage;
      local_58._6_1_ = opt->use_int8_arithmetic;
      local_58._7_1_ = opt->use_packing_layout;
      uStack_50._0_1_ = opt->use_shader_pack8;
      uStack_50._1_1_ = opt->use_subgroup_basic;
      uStack_50._2_1_ = opt->use_subgroup_vote;
      uStack_50._3_1_ = opt->use_subgroup_ballot;
      uStack_50._4_1_ = opt->use_subgroup_shuffle;
      uStack_50._5_1_ = opt->use_image_storage;
      uStack_50._6_1_ = opt->use_tensor_storage;
      uStack_50._7_1_ = opt->use_reserved_0;
      uStack_48._0_4_ = opt->flush_denormals;
      uStack_48._4_1_ = opt->use_local_pool_allocator;
      uStack_48._5_1_ = opt->use_shader_local_memory;
      uStack_48._6_1_ = opt->use_cooperative_matrix;
      uStack_48._7_1_ = opt->use_winograd23_convolution;
      uStack_40._0_1_ = opt->use_winograd43_convolution;
      uStack_40._1_1_ = opt->use_winograd63_convolution;
      uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = opt->use_reserved_7;
      uStack_40._4_1_ = opt->use_reserved_8;
      uStack_40._5_1_ = opt->use_reserved_9;
      uStack_40._6_1_ = opt->use_reserved_10;
      uStack_40._7_1_ = opt->use_reserved_11;
      pAStack_70 = opt->workspace_allocator;
      (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_c8);
    }
    _elempack = 1;
    if (opt->use_packing_layout == true) {
      _elempack = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) & 7) != 0) {
        _elempack = (uint)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]
                                     ) & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
                         (int)_elempack,
                (ulong)_elempack *
                (CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) /
                (ulong)(long)local_c8.elempack),_elempack,opt->blob_allocator);
    iVar9 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar1 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar8 = cpu_support_x86_f16c();
      iVar9 = 0;
      if (iVar8 != 0) {
        innerproduct_fp16s_sse_f16c
                  (&local_c8,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar1,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        iVar9 = 0;
      }
    }
    piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}